

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc-aligned.c
# Opt level: O0

void * mi_recalloc_aligned(void *p,size_t newcount,size_t size,size_t alignment)

{
  void *pvVar1;
  size_t in_RCX;
  size_t in_RDX;
  void *in_RSI;
  mi_heap_t *in_RDI;
  size_t in_stack_ffffffffffffffd8;
  
  mi_prim_get_default_heap();
  pvVar1 = mi_heap_recalloc_aligned(in_RDI,in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
  return pvVar1;
}

Assistant:

mi_decl_nodiscard void* mi_recalloc_aligned(void* p, size_t newcount, size_t size, size_t alignment) mi_attr_noexcept {
  return mi_heap_recalloc_aligned(mi_prim_get_default_heap(), p, newcount, size, alignment);
}